

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

Class object_getClass(id obj)

{
  BOOL BVar1;
  bool bVar2;
  Class local_38;
  Class isa;
  id obj_local;
  uintptr_t addr;
  Class local_10;
  
  if (obj == (id)0x0) {
    obj_local = (id)0x0;
  }
  else {
    BVar1 = isSmallObject(obj);
    if (BVar1 == '\0') {
      local_10 = obj->isa;
    }
    else {
      local_10 = SmallObjectClasses[(ulong)obj & 7];
    }
    local_38 = local_10;
    while( true ) {
      bVar2 = false;
      if (local_38 != (Class)0x0) {
        BVar1 = objc_test_class_flag(local_38,objc_class_flag_hidden_class);
        bVar2 = BVar1 != '\0';
      }
      if (!bVar2) break;
      local_38 = local_38->super_class;
    }
    obj_local = (id)local_38;
  }
  return (Class)obj_local;
}

Assistant:

Class object_getClass(id obj)
{
	CHECK_ARG(obj);
	Class isa = classForObject(obj);
	while ((Nil != isa) && objc_test_class_flag(isa, objc_class_flag_hidden_class))
	{
		isa = isa->super_class;
	}
	return isa;
}